

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChArchiveOut::out<char,12ul>(ChArchiveOut *this,ChNameValue<char[12]> *bVal)

{
  char (*pacVar1) [12];
  char *mname;
  char *pcVar2;
  ChNameValue<char> local_b8;
  undefined1 local_a0 [8];
  ChNameValue<char> array_val;
  char buffer [20];
  size_t i;
  undefined1 local_58 [8];
  ChValueSpecific<char[12]> specVal;
  size_t arraysize;
  ChNameValue<char[12]> *bVal_local;
  ChArchiveOut *this_local;
  
  specVal._ptr_to_val = (char (*) [12])0xc;
  pacVar1 = ChNameValue<char[12]>::value(bVal);
  mname = ChNameValue<char[12]>::name(bVal);
  pcVar2 = ChNameValue<char[12]>::flags(bVal);
  ChValueSpecific<char[12]>::ChValueSpecific
            ((ChValueSpecific<char[12]> *)local_58,pacVar1,mname,*pcVar2);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,(ChValueSpecific<char[12]> *)local_58,specVal._ptr_to_val);
  for (stack0xffffffffffffff90 = (char *)0x0; stack0xffffffffffffff90 < specVal._ptr_to_val;
      register0x00000000 = stack0xffffffffffffff90 + 1) {
    sprintf(&array_val._flags,"%lu",stack0xffffffffffffff90);
    pacVar1 = ChNameValue<char[12]>::value(bVal);
    ChNameValue<char>::ChNameValue
              ((ChNameValue<char> *)local_a0,&array_val._flags,
               stack0xffffffffffffff90 + (long)*pacVar1,'\0');
    ChNameValue<char>::ChNameValue(&local_b8,(ChNameValue<char> *)local_a0);
    (*(this->super_ChArchive)._vptr_ChArchive[6])(this,&local_b8);
    ChNameValue<char>::~ChNameValue(&local_b8);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,local_58,specVal._ptr_to_val);
    ChNameValue<char>::~ChNameValue((ChNameValue<char> *)local_a0);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,local_58,specVal._ptr_to_val);
  ChValueSpecific<char[12]>::~ChValueSpecific((ChValueSpecific<char[12]> *)local_58);
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }